

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O1

uint64_t helper_iwmmxt_madduq_aarch64(uint64_t a,uint64_t b)

{
  return CONCAT44((int)((b & 0xffff0000ffff) >> 0x20) * (int)((a & 0xffff0000ffff) >> 0x20) +
                  (uint)(ushort)(b >> 0x30) * (uint)(ushort)(a >> 0x30),
                  ((uint)(b >> 0x10) & 0xffff) * ((uint)(a >> 0x10) & 0xffff) +
                  (int)(b & 0xffff0000ffff) * (int)(a & 0xffff0000ffff));
}

Assistant:

uint64_t HELPER(iwmmxt_madduq)(uint64_t a, uint64_t b)
{
    a = ((
            ((a >> 0) & 0xffff) * ((b >> 0) & 0xffff) +
            ((a >> 16) & 0xffff) * ((b >> 16) & 0xffff)
        ) & 0xffffffff) | ((
            ((a >> 32) & 0xffff) * ((b >> 32) & 0xffff) +
            ((a >> 48) & 0xffff) * ((b >> 48) & 0xffff)
        ) << 32);
    return a;
}